

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

string * get_graph_by_percentage_abi_cxx11_(uint value,uint len)

{
  uint in_EDX;
  uint in_ESI;
  string *in_RDI;
  uint bar_count;
  uint step;
  string *bars;
  undefined4 local_14;
  
  local_14 = 0;
  std::__cxx11::string::string(in_RDI);
  for (; local_14 < (uint)(long)(((float)in_ESI / 99.9) * (float)in_EDX); local_14 = local_14 + 1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  for (; local_14 < in_EDX; local_14 = local_14 + 1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string get_graph_by_percentage( unsigned value, unsigned len ) 
{
  unsigned step = 0;
  std::string bars;

  unsigned bar_count = ( static_cast<float>(value) / 99.9 * len );

  for( ; step < bar_count; step++ )
  {
    bars.append( "|" );
  }
  for( ; step < len; step++ )
  {
    bars.append( " " );
  }

  return bars;
}